

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O2

void CVmObjDict::cvt_const_cb(void *ctx0,CVmHashEntry *entry0)

{
  _func_int **pp_Var1;
  long lVar2;
  CVmHashEntry *pCVar3;
  
  pCVar3 = entry0 + 1;
  while( true ) {
    pp_Var1 = pCVar3->_vptr_CVmHashEntry;
    if (pp_Var1 == (_func_int **)0x0) {
      return;
    }
    lVar2 = *(long *)(*(long *)(*ctx0 + 0x28) + (ulong)(*(uint *)pp_Var1 >> 10) * 8);
    if ((lVar2 != 0) && (*(long *)(lVar2 + (ulong)(*(uint *)pp_Var1 & 0x3ff) * 8) != 0)) break;
    pCVar3 = (CVmHashEntry *)(pp_Var1 + 1);
  }
  err_throw_a(0x7e5,1,4,entry0->str_,entry0->len_);
}

Assistant:

void CVmObjDict::cvt_const_cb(void *ctx0, class CVmHashEntry *entry0)
{
    cvt_const_ctx *ctx = (cvt_const_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    vm_dict_entry *cur;

    /* inspect the items in this entry's list */
    for (cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* if this item refers to constant data, it's an error */
        if (ctx->mapper->get_pool_addr(cur->obj_) != 0)
            err_throw_a(VMERR_DICT_NO_CONST, 1, ERR_TYPE_TEXTCHAR_LEN,
                        entry->getstr(), entry->getlen());
    }
}